

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O2

_Bool prof_gdump_set(tsdn_t *tsdn,_Bool gdump)

{
  _Bool _Var1;
  
  malloc_mutex_lock(tsdn,&prof_gdump_mtx);
  _Var1 = prof_gdump_val;
  prof_gdump_mtx.field_0.field_0.locked.repr = (atomic_b_t)false;
  prof_gdump_val = gdump;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&prof_gdump_mtx.field_0 + 0x40));
  return _Var1;
}

Assistant:

bool
prof_gdump_set(tsdn_t *tsdn, bool gdump) {
	bool prof_gdump_old;

	malloc_mutex_lock(tsdn, &prof_gdump_mtx);
	prof_gdump_old = prof_gdump_val;
	prof_gdump_val = gdump;
	malloc_mutex_unlock(tsdn, &prof_gdump_mtx);
	return prof_gdump_old;
}